

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationAdvancedCase::iterate
          (BlendEquationAdvancedCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *pTVar3;
  int local_288;
  int local_284;
  int ndx_10;
  int ndx_9;
  int ndx_8;
  allocator<char> local_251;
  string local_250;
  ScopedLogSection local_230;
  ScopedLogSection section_3;
  int ndx_7;
  int ndx_6;
  int ndx_5;
  allocator<char> local_1f1;
  string local_1f0;
  ScopedLogSection local_1d0;
  ScopedLogSection section_2;
  int ndx_4;
  int ndx_3;
  int ndx_2;
  allocator<char> local_191;
  string local_190;
  ScopedLogSection local_170;
  ScopedLogSection section_1;
  int local_160;
  int ndx_1;
  int ndx;
  allocator<char> local_131;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection section;
  deInt32 maxDrawBuffers;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_d0 [8];
  ResultCollector result;
  CallLogWrapper gl;
  deUint32 blendEquationAdvanced [15];
  deUint32 blendEquations [5];
  BlendEquationAdvancedCase *this_local;
  
  stack0xffffffffffffffd8 = 0x800a00008006;
  blendEquationAdvanced[10] = 0x92ae;
  blendEquationAdvanced[0xb] = 0x92af;
  blendEquationAdvanced[0xc] = 0x92b0;
  blendEquationAdvanced[6] = 0x929c;
  blendEquationAdvanced[7] = 0x929e;
  blendEquationAdvanced[8] = 0x92a0;
  blendEquationAdvanced[9] = 0x92ad;
  blendEquationAdvanced[2] = 0x9298;
  blendEquationAdvanced[3] = 0x9299;
  blendEquationAdvanced[4] = 0x929a;
  blendEquationAdvanced[5] = 0x929b;
  blendEquationAdvanced[0] = 0x9296;
  blendEquationAdvanced[1] = 0x9297;
  pRVar2 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar3);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0," // ERROR: ",&local_f1);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_d0,pTVar3,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  section.m_log._0_4_ = 0;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8824,(GLint *)&section);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x575);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"AfterSettingCommon",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"After setting common",(allocator<char> *)((long)&ndx_1 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar3,&local_130,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_1 + 3));
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  glu::CallLogWrapper::glBlendEquation
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x9295);
  for (local_160 = 0; local_160 < (int)section.m_log; local_160 = local_160 + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,local_160,0x9295,this->m_verifierType);
  }
  for (section_1.m_log._4_4_ = 0; section_1.m_log._4_4_ < (int)section.m_log;
      section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,section_1.m_log._4_4_,0x9295,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_110);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"AfterSettingIndexed",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_2,"After setting indexed",(allocator<char> *)((long)&ndx_3 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_170,pTVar3,&local_190,(string *)&ndx_2);
  std::__cxx11::string::~string((string *)&ndx_2);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_3 + 3));
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  for (ndx_4 = 0; ndx_4 < (int)section.m_log; ndx_4 = ndx_4 + 1) {
    glu::CallLogWrapper::glBlendEquationi
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_4,
               blendEquationAdvanced[(long)(ndx_4 % 0xf) + -2]);
  }
  for (section_2.m_log._4_4_ = 0; section_2.m_log._4_4_ < (int)section.m_log;
      section_2.m_log._4_4_ = section_2.m_log._4_4_ + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,section_2.m_log._4_4_,
               blendEquationAdvanced[(long)(section_2.m_log._4_4_ % 0xf) + -2],this->m_verifierType)
    ;
  }
  for (section_2.m_log._0_4_ = 0; (int)section_2.m_log < (int)section.m_log;
      section_2.m_log._0_4_ = (int)section_2.m_log + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,(int)section_2.m_log,
               blendEquationAdvanced[(long)((int)section_2.m_log % 0xf) + -2],this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_170);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"AfterResettingIndexedWithCommon",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_5,"After resetting indexed with common",
             (allocator<char> *)((long)&ndx_6 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_1d0,pTVar3,&local_1f0,(string *)&ndx_5);
  std::__cxx11::string::~string((string *)&ndx_5);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_6 + 3));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  for (ndx_7 = 0; ndx_7 < (int)section.m_log; ndx_7 = ndx_7 + 1) {
    glu::CallLogWrapper::glBlendEquationi
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_7,
               blendEquationAdvanced[(long)(ndx_7 % 0xf) + -2]);
  }
  glu::CallLogWrapper::glBlendEquation
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x9294);
  for (section_3.m_log._4_4_ = 0; section_3.m_log._4_4_ < (int)section.m_log;
      section_3.m_log._4_4_ = section_3.m_log._4_4_ + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,section_3.m_log._4_4_,0x9294,this->m_verifierType);
  }
  for (section_3.m_log._0_4_ = 0; (int)section_3.m_log < (int)section.m_log;
      section_3.m_log._0_4_ = (int)section_3.m_log + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,(int)section_3.m_log,0x9294,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1d0);
  pTVar3 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"AfterResettingIndexedSeparateWithCommon",&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_8,"After resetting indexed separate with common",
             (allocator<char> *)((long)&ndx_9 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_230,pTVar3,&local_250,(string *)&ndx_8);
  std::__cxx11::string::~string((string *)&ndx_8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_9 + 3));
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  for (ndx_10 = 0; ndx_10 < (int)section.m_log; ndx_10 = ndx_10 + 1) {
    glu::CallLogWrapper::glBlendEquationSeparatei
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_10,
               blendEquationAdvanced[(long)(ndx_10 % 5) + 0xe],
               blendEquationAdvanced[(long)(ndx_10 + 1 + ((ndx_10 + 1) / 5) * -5) + 0xe]);
  }
  glu::CallLogWrapper::glBlendEquation
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x9298);
  for (local_284 = 0; local_284 < (int)section.m_log; local_284 = local_284 + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8009,local_284,0x9298,this->m_verifierType);
  }
  for (local_288 = 0; local_288 < (int)section.m_log; local_288 = local_288 + 1) {
    gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_d0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x883d,local_288,0x9298,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_230);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_d0,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_d0);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

BlendEquationAdvancedCase::IterateResult BlendEquationAdvancedCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	const deUint32 blendEquationAdvanced[] =
	{
		GL_MULTIPLY,
		GL_SCREEN,
		GL_OVERLAY,
		GL_DARKEN,
		GL_LIGHTEN,
		GL_COLORDODGE,
		GL_COLORBURN,
		GL_HARDLIGHT,
		GL_SOFTLIGHT,
		GL_DIFFERENCE,
		GL_EXCLUSION,
		GL_HSL_HUE,
		GL_HSL_SATURATION,
		GL_HSL_COLOR,
		GL_HSL_LUMINOSITY
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_SCREEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_SCREEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_SCREEN, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		gl.glBlendEquation(GL_MULTIPLY);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_MULTIPLY, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_MULTIPLY, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedSeparateWithCommon", "After resetting indexed separate with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_LIGHTEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_LIGHTEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_LIGHTEN, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}